

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EncodeOrDecode
          (CommandLineInterface *this,DescriptorPool *pool)

{
  byte bVar1;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  Message *pMVar5;
  bool bVar6;
  ErrorPrinter *local_1a0;
  string local_178 [36];
  uint local_154;
  Parser local_150 [8];
  Parser parser;
  undefined1 local_130 [8];
  ErrorPrinter error_collector;
  FileOutputStream out;
  FileInputStream local_c0 [8];
  FileInputStream in;
  scoped_ptr<google::protobuf::Message> local_58;
  scoped_ptr<google::protobuf::Message> message;
  DynamicMessageFactory dynamic_factory;
  Descriptor *type;
  DescriptorPool *pool_local;
  CommandLineInterface *this_local;
  
  lVar2 = google::protobuf::DescriptorPool::FindMessageTypeByName((string *)pool);
  if (lVar2 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Type not defined: ");
    poVar3 = std::operator<<(poVar3,(string *)&this->codec_type_);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
    goto LAB_0017d9d4;
  }
  google::protobuf::DynamicMessageFactory::DynamicMessageFactory
            ((DynamicMessageFactory *)&message,pool);
  plVar4 = (long *)google::protobuf::DynamicMessageFactory::GetPrototype((Descriptor *)&message);
  pMVar5 = (Message *)(**(code **)(*plVar4 + 0x18))();
  internal::scoped_ptr<google::protobuf::Message>::scoped_ptr(&local_58,pMVar5);
  if (this->mode_ == MODE_ENCODE) {
    anon_unknown_0::SetFdToTextMode(0);
    anon_unknown_0::SetFdToBinaryMode(1);
  }
  else {
    anon_unknown_0::SetFdToBinaryMode(0);
    anon_unknown_0::SetFdToTextMode(1);
  }
  google::protobuf::io::FileInputStream::FileInputStream(local_c0,0,-1);
  google::protobuf::io::FileOutputStream::FileOutputStream
            ((FileOutputStream *)&error_collector.tree_,1,-1);
  if (this->mode_ == MODE_ENCODE) {
    ErrorPrinter::ErrorPrinter((ErrorPrinter *)local_130,this->error_format_,(DiskSourceTree *)0x0);
    google::protobuf::TextFormat::Parser::Parser(local_150);
    local_1a0 = (ErrorPrinter *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x130) {
      local_1a0 = &error_collector;
    }
    TextFormat::Parser::RecordErrorsTo(local_150,(ErrorCollector *)local_1a0);
    TextFormat::Parser::AllowPartialMessage(local_150,true);
    internal::scoped_ptr<google::protobuf::Message>::get(&local_58);
    bVar1 = google::protobuf::TextFormat::Parser::Parse
                      ((ZeroCopyInputStream *)local_150,(Message *)local_c0);
    bVar6 = (bVar1 & 1) == 0;
    if (bVar6) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to parse input.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
    }
    local_154 = (uint)bVar6;
    google::protobuf::TextFormat::Parser::~Parser(local_150);
    ErrorPrinter::~ErrorPrinter((ErrorPrinter *)local_130);
    if (local_154 == 0) {
LAB_0017d786:
      pMVar5 = internal::scoped_ptr<google::protobuf::Message>::operator->(&local_58);
      bVar1 = (**(code **)(*(long *)pMVar5 + 0x28))();
      if ((bVar1 & 1) == 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "warning:  Input message is missing required fields:  ");
        pMVar5 = internal::scoped_ptr<google::protobuf::Message>::operator->(&local_58);
        (**(code **)(*(long *)pMVar5 + 0x30))(local_178);
        poVar3 = std::operator<<(poVar3,local_178);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_178);
      }
      if (this->mode_ == MODE_ENCODE) {
        pMVar5 = internal::scoped_ptr<google::protobuf::Message>::operator->(&local_58);
        bVar1 = google::protobuf::MessageLite::SerializePartialToZeroCopyStream
                          ((ZeroCopyOutputStream *)pMVar5);
        if ((bVar1 & 1) == 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"output: I/O error.");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = 0;
          local_154 = 1;
        }
        else {
LAB_0017d96e:
          this_local._7_1_ = 1;
          local_154 = 1;
        }
      }
      else {
        pMVar5 = internal::scoped_ptr<google::protobuf::Message>::operator*(&local_58);
        bVar1 = google::protobuf::TextFormat::Print
                          (pMVar5,(ZeroCopyOutputStream *)&error_collector.tree_);
        if ((bVar1 & 1) != 0) goto LAB_0017d96e;
        poVar3 = std::operator<<((ostream *)&std::cerr,"output: I/O error.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
        local_154 = 1;
      }
    }
  }
  else {
    pMVar5 = internal::scoped_ptr<google::protobuf::Message>::operator->(&local_58);
    bVar1 = google::protobuf::MessageLite::ParsePartialFromZeroCopyStream
                      ((ZeroCopyInputStream *)pMVar5);
    if ((bVar1 & 1) != 0) goto LAB_0017d786;
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to parse input.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
    local_154 = 1;
  }
  google::protobuf::io::FileOutputStream::~FileOutputStream
            ((FileOutputStream *)&error_collector.tree_);
  google::protobuf::io::FileInputStream::~FileInputStream(local_c0);
  internal::scoped_ptr<google::protobuf::Message>::~scoped_ptr(&local_58);
  google::protobuf::DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&message)
  ;
LAB_0017d9d4:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CommandLineInterface::EncodeOrDecode(const DescriptorPool* pool) {
  // Look up the type.
  const Descriptor* type = pool->FindMessageTypeByName(codec_type_);
  if (type == NULL) {
    cerr << "Type not defined: " << codec_type_ << endl;
    return false;
  }

  DynamicMessageFactory dynamic_factory(pool);
  scoped_ptr<Message> message(dynamic_factory.GetPrototype(type)->New());

  if (mode_ == MODE_ENCODE) {
    SetFdToTextMode(STDIN_FILENO);
    SetFdToBinaryMode(STDOUT_FILENO);
  } else {
    SetFdToBinaryMode(STDIN_FILENO);
    SetFdToTextMode(STDOUT_FILENO);
  }

  io::FileInputStream in(STDIN_FILENO);
  io::FileOutputStream out(STDOUT_FILENO);

  if (mode_ == MODE_ENCODE) {
    // Input is text.
    ErrorPrinter error_collector(error_format_);
    TextFormat::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    parser.AllowPartialMessage(true);

    if (!parser.Parse(&in, message.get())) {
      cerr << "Failed to parse input." << endl;
      return false;
    }
  } else {
    // Input is binary.
    if (!message->ParsePartialFromZeroCopyStream(&in)) {
      cerr << "Failed to parse input." << endl;
      return false;
    }
  }

  if (!message->IsInitialized()) {
    cerr << "warning:  Input message is missing required fields:  "
         << message->InitializationErrorString() << endl;
  }

  if (mode_ == MODE_ENCODE) {
    // Output is binary.
    if (!message->SerializePartialToZeroCopyStream(&out)) {
      cerr << "output: I/O error." << endl;
      return false;
    }
  } else {
    // Output is text.
    if (!TextFormat::Print(*message, &out)) {
      cerr << "output: I/O error." << endl;
      return false;
    }
  }

  return true;
}